

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

char * ucs4_to_utf8(ucs4_t *ucs4,size_t length)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  long local_60;
  size_t delta;
  ucs4_t byte [4];
  byte *pbStack_40;
  ucs4_t c;
  char *putf8;
  char *utf8;
  size_t freesize;
  size_t i;
  size_t length_local;
  ucs4_t *ucs4_local;
  
  i = length;
  if (length == 0) {
    i = 0xffffffffffffffff;
  }
  freesize = 0;
  while( true ) {
    sVar4 = freesize;
    bVar11 = false;
    if (freesize < i) {
      bVar11 = ucs4[freesize] != 0;
    }
    if (!bVar11) break;
    freesize = freesize + 1;
  }
  utf8 = (char *)0x400;
  pbStack_40 = (byte *)malloc(0x400);
  freesize = 0;
  putf8 = (char *)pbStack_40;
  do {
    if (sVar4 <= freesize) {
      pcVar10 = (char *)realloc(putf8,((long)pbStack_40 - (long)putf8) + 1);
      pcVar10[(long)pbStack_40 - (long)putf8] = '\0';
      return pcVar10;
    }
    if ((long)(utf8 + -6) < 1) {
      utf8 = (char *)(pbStack_40 + -(long)putf8);
      putf8 = (char *)realloc(putf8,(long)utf8 * 2);
      pbStack_40 = (byte *)(putf8 + (long)utf8);
    }
    uVar1 = ucs4[freesize];
    uVar5 = uVar1 & 0xff;
    uVar6 = uVar1 >> 8;
    uVar7 = uVar6 & 0xff;
    uVar8 = uVar1 >> 0x10;
    uVar9 = uVar8 & 0xff;
    bVar2 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *pbStack_40 = bVar2 & 0x7f;
      local_60 = 1;
    }
    else if (uVar1 < 0x800) {
      pbStack_40[1] = (bVar2 & 0x3f) + 0x80;
      *pbStack_40 = (char)(uVar5 >> 6) + -0x40 + (char)((uVar6 & 7) << 2);
      local_60 = 2;
    }
    else if (uVar1 < 0x10000) {
      pbStack_40[2] = (bVar2 & 0x3f) + 0x80;
      pbStack_40[1] = (char)(uVar5 >> 6) + -0x80 + (char)((uVar6 & 0xf) << 2);
      *pbStack_40 = (char)(uVar7 >> 4) - 0x20;
      local_60 = 3;
    }
    else if (uVar1 < 0x200000) {
      pbStack_40[3] = (bVar2 & 0x3f) + 0x80;
      pbStack_40[2] = (char)(uVar5 >> 6) + -0x80 + (char)((uVar6 & 0xf) << 2);
      pbStack_40[1] = (char)(uVar7 >> 4) + -0x80 + (char)((uVar8 & 3) << 4);
      *pbStack_40 = ((byte)(uVar9 >> 2) & 7) - 0x10;
      local_60 = 4;
    }
    else {
      bVar3 = (byte)(uVar1 >> 0x18);
      if (uVar1 < 0x4000000) {
        pbStack_40[4] = (bVar2 & 0x3f) + 0x80;
        pbStack_40[3] = (char)(uVar5 >> 6) + -0x80 + (char)((uVar6 & 0xf) << 2);
        pbStack_40[2] = (char)(uVar7 >> 4) + -0x80 + (char)((uVar8 & 3) << 4);
        pbStack_40[1] = (char)(uVar9 >> 2) + 0x80;
        *pbStack_40 = (bVar3 & 3) - 8;
        local_60 = 5;
      }
      else {
        if (0x7fffffff < uVar1) {
          free(putf8);
          return (char *)0xffffffffffffffff;
        }
        pbStack_40[5] = (bVar2 & 0x3f) + 0x80;
        pbStack_40[4] = (char)(uVar5 >> 6) + -0x80 + (char)((uVar6 & 0xf) << 2);
        pbStack_40[3] = (char)(uVar7 >> 4) + -0x80 + (char)((uVar8 & 3) << 4);
        pbStack_40[2] = (char)(uVar9 >> 2) + 0x80;
        pbStack_40[1] = (bVar3 & 0x3f) + 0x80;
        *pbStack_40 = (bVar3 >> 6 & 1) - 4;
        local_60 = 6;
      }
    }
    pbStack_40 = pbStack_40 + local_60;
    utf8 = utf8 + -local_60;
    freesize = freesize + 1;
  } while( true );
}

Assistant:

char * ucs4_to_utf8(const ucs4_t * ucs4, size_t length)
{
	if (length == 0)
		length = (size_t) -1;
	size_t i;
	for (i = 0; i < length && ucs4[i] != 0; i ++);
	length = i;

	size_t freesize = INITIAL_BUFF_SIZE;
	char * utf8 = (char *) malloc(sizeof(char) * freesize);
	char * putf8 = utf8;

	for (i = 0; i < length; i ++)
	{
		if ((ssize_t)freesize - 6 <= 0)
		{
			freesize = putf8 - utf8;
			utf8 = (char *) realloc(utf8, sizeof(char) * (freesize + freesize));
			putf8 = utf8 + freesize;
		}

		ucs4_t c = ucs4[i];
		ucs4_t byte[4] =
		{
			(c >> 0) & BITMASK(8), (c >> 8) & BITMASK(8),
			(c >> 16) & BITMASK(8), (c >> 24) & BITMASK(8)
		};
		
		size_t delta = 0;

		if (c <= 0x7F)
		{
			/* U-00000000 - U-0000007F */
			/* 0xxxxxxx */
			putf8[0] = byte[0] & BITMASK(7);
			delta = 1;
		}
		else if (c <= 0x7FF)
		{
			/* U-00000080 - U-000007FF */
			/* 110xxxxx 10xxxxxx */
			putf8[1] = 0x80 + (byte[0] & BITMASK(6));
			putf8[0] = 0xC0 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(3)) << 2);
			delta = 2;
		}
		else if (c <= 0xFFFF)
		{
			/* U-00000800 - U-0000FFFF */
			/* 1110xxxx 10xxxxxx 10xxxxxx */
			putf8[2] = 0x80 + (byte[0] & BITMASK(6));
			putf8[1] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[0] = 0xE0 + ((byte[1] >> 4) & BITMASK(4));
			delta = 3;
		}
		else if (c <= 0x1FFFFF)
		{
			/* U-00010000 - U-001FFFFF */
			/* 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
			putf8[3] = 0x80 + (byte[0] & BITMASK(6));
			putf8[2] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[1] = 0x80 + ((byte[1] >> 4) & BITMASK(4)) +
					((byte[2] & BITMASK(2)) << 4);
			putf8[0] = 0xF0 + ((byte[2] >> 2) & BITMASK(3));
			delta = 4;
		}
		else if (c <= 0x3FFFFFF)
		{
			/* U-00200000 - U-03FFFFFF */
			/* 111110xx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			putf8[4] = 0x80 + (byte[0] & BITMASK(6));
			putf8[3] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[2] = 0x80 + ((byte[1] >> 4) & BITMASK(4)) +
					((byte[2] & BITMASK(2)) << 4);
			putf8[1] = 0x80 + ((byte[2] >> 2) & BITMASK(6));
			putf8[0] = 0xF8 + (byte[3] & BITMASK(2));
			delta = 5;

		}
		else if (c <= 0x7FFFFFFF)
		{
			/* U-04000000 - U-7FFFFFFF */
			/* 1111110x 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			putf8[5] = 0x80 + (byte[0] & BITMASK(6));
			putf8[4] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[3] = 0x80 + ((byte[1] >> 4) & BITMASK(4)) +
					((byte[2] & BITMASK(2)) << 4);
			putf8[2] = 0x80 + ((byte[2] >> 2) & BITMASK(6));
			putf8[1] = 0x80 + (byte[3] & BITMASK(6));
			putf8[0] = 0xFC + ((byte[3] >> 6) & BITMASK(1)); 
			delta = 6;
		}
		else
		{
			free(utf8);
			return (char *) -1;
		}
		
		putf8 += delta;
		freesize -= delta;
	}

	length = (putf8 - utf8 + 1);
	utf8 = (char *) realloc(utf8, sizeof(char) * length);
	utf8[length - 1] = '\0';
	return utf8;
}